

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O0

Amap_Lib_t * Amap_LibReadFile(char *pFileName,int fVerbose)

{
  char *pBuffer_00;
  char *pcVar1;
  char *pBuffer;
  Amap_Lib_t *pLib;
  int fVerbose_local;
  char *pFileName_local;
  
  pBuffer_00 = Amap_LoadFile(pFileName);
  if (pBuffer_00 == (char *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)Amap_LibReadBuffer(pBuffer_00,fVerbose);
    if ((Amap_Lib_t *)pFileName_local != (Amap_Lib_t *)0x0) {
      pcVar1 = Abc_UtilStrsav(pFileName);
      ((Amap_Lib_t *)pFileName_local)->pName = pcVar1;
    }
    if (pBuffer_00 != (char *)0x0) {
      free(pBuffer_00);
    }
  }
  return (Amap_Lib_t *)pFileName_local;
}

Assistant:

Amap_Lib_t * Amap_LibReadFile( char * pFileName, int fVerbose )
{
    Amap_Lib_t * pLib;
    char * pBuffer;
    pBuffer = Amap_LoadFile( pFileName );
    if ( pBuffer == NULL )
        return NULL;
    pLib = Amap_LibReadBuffer( pBuffer, fVerbose );
    if ( pLib )
        pLib->pName = Abc_UtilStrsav( pFileName );
    ABC_FREE( pBuffer );
    return pLib;
}